

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

String * __thiscall
glcts::ShaderStorageBufferLayoutBindingCase::buildBlock
          (String *__return_storage_ptr__,ShaderStorageBufferLayoutBindingCase *this,String *name,
          String *type)

{
  ostream *poVar1;
  ostringstream s;
  ostream oStack_198;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_198);
  std::operator<<(&oStack_198,"{");
  poVar1 = std::operator<<(&oStack_198,(string *)type);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)name);
  std::operator<<(poVar1,"_a[2];\n");
  std::operator<<(&oStack_198,"}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_198);
  return __return_storage_ptr__;
}

Assistant:

String buildBlock(const String& name, const String& type)
	{
		std::ostringstream s;
		s << "{";
		s << type << " " << name << "_a[2];\n";
		s << "}";
		return s.str();
	}